

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.hpp
# Opt level: O3

void boost::algorithm::trim_left_if<std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Input,
               is_any_ofF<char> *IsSpace)

{
  char *pcVar1;
  bool bVar2;
  anon_union_16_2_ba345be5_for_m_Storage *__dest;
  char *pcVar3;
  ulong uVar4;
  size_type sVar5;
  char *pcVar6;
  char *pcVar7;
  anon_union_16_2_ba345be5_for_m_Storage local_48;
  ulong local_38;
  
  __dest = &local_48;
  pcVar1 = (Input->_M_dataplus)._M_p;
  sVar5 = Input->_M_string_length;
  uVar4 = IsSpace->m_Size;
  local_48.m_dynSet = (set_value_type *)0x0;
  local_38 = uVar4;
  if (0x10 < uVar4) {
    __dest = (anon_union_16_2_ba345be5_for_m_Storage *)operator_new__(uVar4);
    IsSpace = (is_any_ofF<char> *)(IsSpace->m_Storage).m_dynSet;
    local_48.m_dynSet = (set_value_type *)__dest;
  }
  memcpy(__dest,IsSpace,uVar4);
  if (sVar5 == 0) {
    sVar5 = 0;
    pcVar3 = pcVar1;
    pcVar7 = pcVar1;
  }
  else {
    pcVar3 = pcVar1 + sVar5;
    pcVar6 = pcVar1;
    do {
      bVar2 = detail::is_any_ofF<char>::operator()((is_any_ofF<char> *)&local_48,*pcVar6);
      pcVar7 = pcVar6;
      if (!bVar2) break;
      pcVar6 = pcVar6 + 1;
      sVar5 = sVar5 - 1;
      pcVar7 = pcVar3;
    } while (sVar5 != 0);
    sVar5 = Input->_M_string_length;
    pcVar3 = (Input->_M_dataplus)._M_p;
  }
  uVar4 = (long)pcVar1 - (long)pcVar3;
  if (pcVar3 + sVar5 == pcVar7) {
    Input->_M_string_length = uVar4;
    pcVar3[uVar4] = '\0';
  }
  else {
    std::__cxx11::string::_M_erase((ulong)Input,uVar4);
  }
  if ((0x10 < local_38) && (local_48.m_dynSet != (set_value_type *)0x0)) {
    operator_delete__(local_48.m_dynSet);
  }
  return;
}

Assistant:

inline void trim_left_if(SequenceT& Input, PredicateT IsSpace)
        {
            Input.erase( 
                ::boost::begin(Input),
                ::boost::algorithm::detail::trim_begin( 
                    ::boost::begin(Input), 
                    ::boost::end(Input), 
                    IsSpace));
        }